

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

spv_result_t spvTextToLiteral(char *textValue,spv_literal_t *pLiteral)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  value_t vVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  
  sVar5 = strlen(textValue);
  if (sVar5 == 0) {
    return SPV_FAILED_MATCH;
  }
  bVar4 = false;
  bVar3 = false;
  iVar7 = 0;
  bVar2 = 0;
  sVar8 = 0;
  do {
    bVar1 = textValue[sVar8];
    if (9 < bVar1 - 0x30) {
      if (bVar1 == 0x2d) {
        if (sVar8 == 0) {
          bVar3 = true;
          bVar4 = bVar3;
        }
        else {
          bVar2 = 1;
          bVar3 = bVar4;
        }
      }
      else if (bVar1 == 0x2e) {
        iVar7 = iVar7 + 1;
      }
      else {
        bVar2 = 1;
        sVar8 = sVar5;
      }
    }
    sVar8 = sVar8 + 1;
  } while (sVar8 < sVar5);
  pLiteral->type = 99;
  if (((bool)(bVar2 | 1 < iVar7)) || ((sVar5 == 1 && (bVar3)))) {
    if (sVar5 == 1) {
      return SPV_FAILED_MATCH;
    }
    if (*textValue != '\"') {
      return SPV_FAILED_MATCH;
    }
    if (textValue[sVar5 - 1] != '\"') {
      return SPV_FAILED_MATCH;
    }
    if (textValue + 1 != textValue + (sVar5 - 1)) {
      lVar9 = 0;
      bVar3 = false;
      do {
        bVar3 = (bool)((textValue + 1)[lVar9] == '\\' & (bVar3 ^ 1U));
        if (!bVar3) {
          if (0x3fffb < (pLiteral->str)._M_string_length) {
            return SPV_ERROR_OUT_OF_MEMORY;
          }
          std::__cxx11::string::push_back((char)pLiteral + '\x10');
        }
        lVar9 = lVar9 + 1;
      } while (sVar5 - 2 != lVar9);
    }
    pLiteral->type = SPV_LITERAL_TYPE_STRING;
    return SPV_SUCCESS;
  }
  if (iVar7 == 1) {
    dVar10 = strtod(textValue,(char **)0x0);
    dVar11 = (double)(float)dVar10;
    if ((dVar10 == dVar11) && (!NAN(dVar10) && !NAN(dVar11))) {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
      (pLiteral->value).f = (float)dVar10;
      return SPV_SUCCESS;
    }
    pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
    (pLiteral->value).d = dVar10;
    return SPV_SUCCESS;
  }
  if (bVar3) {
    vVar6.i64 = strtoll(textValue,(char **)0x0,10);
    if (vVar6.i32 != vVar6.i64) {
      pLiteral->type = SPV_LITERAL_TYPE_INT_64;
LAB_005f3e0c:
      pLiteral->value = vVar6;
      return SPV_SUCCESS;
    }
    pLiteral->type = SPV_LITERAL_TYPE_INT_32;
  }
  else {
    vVar6.u64 = strtoull(textValue,(char **)0x0,10);
    if (vVar6.u64 >> 0x20 != 0) {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
      goto LAB_005f3e0c;
    }
    pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
  }
  (pLiteral->value).i32 = vVar6.i32;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t spvTextToLiteral(const char* textValue, spv_literal_t* pLiteral) {
  bool isSigned = false;
  int numPeriods = 0;
  bool isString = false;

  const size_t len = strlen(textValue);
  if (len == 0) return SPV_FAILED_MATCH;

  for (uint64_t index = 0; index < len; ++index) {
    switch (textValue[index]) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        break;
      case '.':
        numPeriods++;
        break;
      case '-':
        if (index == 0) {
          isSigned = true;
        } else {
          isString = true;
        }
        break;
      default:
        isString = true;
        index = len;  // break out of the loop too.
        break;
    }
  }

  pLiteral->type = spv_literal_type_t(99);

  if (isString || numPeriods > 1 || (isSigned && len == 1)) {
    if (len < 2 || textValue[0] != '"' || textValue[len - 1] != '"')
      return SPV_FAILED_MATCH;
    bool escaping = false;
    for (const char* val = textValue + 1; val != textValue + len - 1; ++val) {
      if ((*val == '\\') && (!escaping)) {
        escaping = true;
      } else {
        // Have to save space for the null-terminator
        if (pLiteral->str.size() >= SPV_LIMIT_LITERAL_STRING_BYTES_MAX)
          return SPV_ERROR_OUT_OF_MEMORY;
        pLiteral->str.push_back(*val);
        escaping = false;
      }
    }

    pLiteral->type = SPV_LITERAL_TYPE_STRING;
  } else if (numPeriods == 1) {
    double d = std::strtod(textValue, nullptr);
    float f = (float)d;
    if (d == (double)f) {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_32;
      pLiteral->value.f = f;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_FLOAT_64;
      pLiteral->value.d = d;
    }
  } else if (isSigned) {
    int64_t i64 = strtoll(textValue, nullptr, 10);
    int32_t i32 = (int32_t)i64;
    if (i64 == (int64_t)i32) {
      pLiteral->type = SPV_LITERAL_TYPE_INT_32;
      pLiteral->value.i32 = i32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_INT_64;
      pLiteral->value.i64 = i64;
    }
  } else {
    uint64_t u64 = strtoull(textValue, nullptr, 10);
    uint32_t u32 = (uint32_t)u64;
    if (u64 == (uint64_t)u32) {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_32;
      pLiteral->value.u32 = u32;
    } else {
      pLiteral->type = SPV_LITERAL_TYPE_UINT_64;
      pLiteral->value.u64 = u64;
    }
  }

  return SPV_SUCCESS;
}